

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmFuncts.cpp
# Opt level: O2

string * AsmFuncts::getFuncCode(string *__return_storage_ptr__,string *op)

{
  long lVar1;
  __type_conflict _Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  ulong uVar3;
  long lVar4;
  allocator local_29;
  
  uVar3 = 0xffffffffffffffff;
  lVar1 = -0x20;
  do {
    lVar4 = lVar1;
    uVar3 = uVar3 + 1;
    if ((ulong)((long)Codes::typeROp_abi_cxx11_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)Codes::typeROp_abi_cxx11_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 6) <= uVar3) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"000000",&local_29);
      return __return_storage_ptr__;
    }
    _Var2 = std::operator==(op,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&Codes::typeROp_abi_cxx11_.
                                       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1].first.
                                       _M_dataplus._M_p + lVar4));
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            ((long)&((Codes::typeROp_abi_cxx11_.
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->second)._M_dataplus._M_p + lVar4);
    if (_Var2) goto LAB_0012be05;
    _Var2 = std::operator==(op,__rhs);
    lVar1 = lVar4 + 0x40;
  } while (!_Var2);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&Codes::typeROp_abi_cxx11_.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[1].first._M_dataplus._M_p + lVar4);
LAB_0012be05:
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__rhs);
  return __return_storage_ptr__;
}

Assistant:

string AsmFuncts::getFuncCode(string op) {
    for (int i = 0; i < Codes::typeROp.size(); i++) {
        if(op == Codes::typeROp[i].second)
            return Codes::typeROp[i].first;
        if(op == Codes::typeROp[i].first)
            return Codes::typeROp[i].second;
    }
    return "000000";
}